

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall GlobOpt::TryReplaceLdLen(GlobOpt *this,Instr **instr)

{
  Sym *this_00;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Opnd *pOVar4;
  SymOpnd *this_01;
  undefined4 *puVar5;
  PropertySym *pPVar6;
  RegOpnd *this_02;
  GlobOptBlockData *pGVar7;
  Value *this_03;
  ValueInfo *this_04;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar8;
  ValueInfo *objectValueInfo;
  RegOpnd *newopnd;
  PropertySym *originalPropertySym;
  Sym *sym;
  SymOpnd *opnd;
  Instr **instr_local;
  GlobOpt *this_local;
  
  if ((*instr)->m_opcode != LdLen_A) {
    return;
  }
  pOVar4 = IR::Instr::GetSrc1(*instr);
  if (pOVar4 == (Opnd *)0x0) {
    return;
  }
  pOVar4 = IR::Instr::GetSrc1(*instr);
  bVar2 = IR::Opnd::IsSymOpnd(pOVar4);
  if (!bVar2) {
    return;
  }
  pOVar4 = IR::Instr::GetSrc1(*instr);
  this_01 = IR::Opnd::AsSymOpnd(pOVar4);
  this_00 = this_01->m_sym;
  bVar2 = Sym::IsPropertySym(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x983,"(sym->IsPropertySym())","sym->IsPropertySym()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pPVar6 = Sym::AsPropertySym(this_00);
  this_02 = IR::RegOpnd::New(pPVar6->m_stackSym,TyVar,(*instr)->m_func);
  pGVar7 = CurrentBlockData(this);
  this_03 = GlobOptBlockData::FindValue(pGVar7,&pPVar6->m_stackSym->super_Sym);
  this_04 = ::Value::GetValueInfo(this_03);
  bVar2 = ValueType::IsLikelyAnyArray(&this_04->super_ValueType);
  if ((((bVar2) || (bVar2 = ValueType::HasHadStringTag(&this_04->super_ValueType), bVar2)) ||
      (bVar2 = ValueType::IsLikelyString(&this_04->super_ValueType), bVar2)) ||
     (bVar2 = IR::Opnd::IsArgumentsObject(&this_02->super_Opnd), bVar2)) {
LAB_0058425d:
    bVar2 = IR::Opnd::GetIsJITOptimizedReg(&this_01->super_Opnd);
    IR::Opnd::SetIsJITOptimizedReg(&this_02->super_Opnd,bVar2);
    paVar8 = &ValueInfo::Type(this_04)->field_0;
    IR::Opnd::SetValueType
              (&this_02->super_Opnd,
               (ValueType)*(anon_union_2_4_ea848c7b_for_ValueType_13 *)&paVar8->field_0);
    bVar2 = IR::Opnd::GetIsDead(&this_01->super_Opnd);
    IR::Opnd::SetIsDead(&this_02->super_Opnd,bVar2);
    IR::Instr::ReplaceSrc1(*instr,&this_02->super_Opnd);
  }
  else {
    pGVar7 = CurrentBlockData(this);
    if (pGVar7->argObjSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pGVar7 = CurrentBlockData(this);
      BVar3 = GlobOptBlockData::IsArgumentsOpnd(pGVar7,&this_02->super_Opnd);
      if (BVar3 != 0) goto LAB_0058425d;
    }
    (*instr)->m_opcode = LdFld;
  }
  return;
}

Assistant:

void
GlobOpt::TryReplaceLdLen(IR::Instr *& instr)
{
    // Change LdLen on objects other than arrays, strings, and 'arguments' to LdFld. Otherwise, convert the SymOpnd to a RegOpnd here.
    if (instr->m_opcode == Js::OpCode::LdLen_A && instr->GetSrc1() && instr->GetSrc1()->IsSymOpnd())
    {
        IR::SymOpnd * opnd = instr->GetSrc1()->AsSymOpnd();
        Sym *sym = opnd->m_sym;
        Assert(sym->IsPropertySym());
        PropertySym *originalPropertySym = sym->AsPropertySym();

        IR::RegOpnd* newopnd = IR::RegOpnd::New(originalPropertySym->m_stackSym, IRType::TyVar, instr->m_func);
        ValueInfo *const objectValueInfo = CurrentBlockData()->FindValue(originalPropertySym->m_stackSym)->GetValueInfo();
        // things we'd emit a fast path for
        if (
            objectValueInfo->IsLikelyAnyArray() ||
            objectValueInfo->HasHadStringTag() ||
            objectValueInfo->IsLikelyString() ||
            newopnd->IsArgumentsObject() ||
            (CurrentBlockData()->argObjSyms && CurrentBlockData()->IsArgumentsOpnd(newopnd))
            )
        {
            // We need to properly transfer over the information from the old operand, which is
            // a SymOpnd, to the new one, which is a RegOpnd. Unfortunately, the types mean the
            // normal copy methods won't work here, so we're going to directly copy data.
            newopnd->SetIsJITOptimizedReg(opnd->GetIsJITOptimizedReg());
            newopnd->SetValueType(objectValueInfo->Type());
            newopnd->SetIsDead(opnd->GetIsDead());
            instr->ReplaceSrc1(newopnd);
        }
        else
        {
            // otherwise, change the instruction to an LdFld here.
            instr->m_opcode = Js::OpCode::LdFld;
        }
    }
}